

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall MemoryAccountant::~MemoryAccountant(MemoryAccountant *this)

{
  MemoryAccountant *this_local;
  
  clear(this);
  return;
}

Assistant:

MemoryAccountant::~MemoryAccountant()
{
    clear();
}